

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileReader.cxx
# Opt level: O2

optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> *
cmReadGccDepfile(optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 *__return_storage_ptr__,char *filePath,string *prefix,
                GccDepfilePrependPaths prependPaths)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rule;
  pointer pbVar5;
  enable_if_t<is_constructible_v<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>,_std::vector<cmGccStyleDependency>_>,_optional<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>_>_>
  *deps;
  cmGccDepfileLexerHelper helper;
  iterator __end1;
  char local_99;
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> *local_98;
  pointer local_90;
  cmGccDepfileLexerHelper local_88;
  pointer local_60;
  string local_58;
  
  local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_88.HelperState = Rule;
  local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_98 = __return_storage_ptr__;
  bVar3 = cmGccDepfileLexerHelper::readFile(&local_88,filePath);
  pcVar4 = local_88.Content.
           super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar3) {
    local_60 = (pointer)CONCAT44(local_88.Content.
                                 super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_88.Content.
                                 super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    pcVar2 = (pointer)CONCAT44(local_88.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_88.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_88.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    *(pointer *)
     &(local_98->
      super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ._M_payload._M_value.
      super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl =
         pcVar4;
    *(pointer *)
     ((long)&(local_98->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 8) = local_60;
    *(pointer *)
     ((long)&(local_98->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 0x10) = pcVar2;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    (local_98->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = true;
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
              ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)&local_58);
    while (pcVar4 != local_60) {
      pbVar1 = (pcVar4->rules).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_90 = pcVar4;
      for (pbVar5 = (pcVar4->rules).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        if ((prependPaths == All) && (prefix->_M_string_length != 0)) {
          bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar5);
          if (!bVar3) {
            local_99 = '/';
            cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                      (&local_58,prefix,&local_99,pbVar5);
            std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_58);
            std::__cxx11::string::~string((string *)&local_58);
          }
        }
        bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar5);
        if (bVar3) {
          cmsys::SystemTools::CollapseFullPath(&local_58,pbVar5);
          std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
        cmSystemTools::ConvertToLongPath(pbVar5);
      }
      pbVar1 = (local_90->paths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = (local_90->paths).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        if (prefix->_M_string_length != 0) {
          bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar5);
          if (!bVar3) {
            local_99 = '/';
            cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                      (&local_58,prefix,&local_99,pbVar5);
            std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_58);
            std::__cxx11::string::~string((string *)&local_58);
          }
        }
        bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar5);
        if (bVar3) {
          cmsys::SystemTools::CollapseFullPath(&local_58,pbVar5);
          std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
        cmSystemTools::ConvertToLongPath(pbVar5);
      }
      pcVar4 = local_90 + 1;
    }
  }
  else {
    (local_98->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = false;
  }
  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
            (&local_88.Content);
  return local_98;
}

Assistant:

cm::optional<cmGccDepfileContent> cmReadGccDepfile(
  const char* filePath, const std::string& prefix,
  GccDepfilePrependPaths prependPaths)
{
  cmGccDepfileLexerHelper helper;
  if (!helper.readFile(filePath)) {
    return cm::nullopt;
  }
  auto deps = cm::make_optional(std::move(helper).extractContent());

  for (auto& dep : *deps) {
    for (auto& rule : dep.rules) {
      if (prependPaths == GccDepfilePrependPaths::All && !prefix.empty() &&
          !cmSystemTools::FileIsFullPath(rule)) {
        rule = cmStrCat(prefix, '/', rule);
      }
      if (cmSystemTools::FileIsFullPath(rule)) {
        rule = cmSystemTools::CollapseFullPath(rule);
      }
      cmSystemTools::ConvertToLongPath(rule);
    }
    for (auto& path : dep.paths) {
      if (!prefix.empty() && !cmSystemTools::FileIsFullPath(path)) {
        path = cmStrCat(prefix, '/', path);
      }
      if (cmSystemTools::FileIsFullPath(path)) {
        path = cmSystemTools::CollapseFullPath(path);
      }
      cmSystemTools::ConvertToLongPath(path);
    }
  }

  return deps;
}